

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileSimpleString(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  char *zData;
  sxi32 sVar1;
  jx9_value *pjVar2;
  bool bVar3;
  sxu32 local_4c;
  jx9_value *pjStack_48;
  sxu32 nIdx;
  jx9_value *pObj;
  char *zEnd;
  char *zCur;
  char *zIn;
  SyString *pStr;
  jx9_gen_state *pjStack_18;
  sxi32 iCompileFlag_local;
  jx9_gen_state *pGen_local;
  
  zIn = (char *)pGen->pIn;
  local_4c = 0;
  zCur = (((SyToken *)zIn)->sData).zString;
  pObj = (jx9_value *)((long)&((jx9_value *)zCur)->x + (ulong)(((SyToken *)zIn)->sData).nByte);
  pStr._4_4_ = iCompileFlag;
  pjStack_18 = pGen;
  if (pObj < zCur) {
    jx9VmEmitInstr(pGen->pVm,4,0,0,(void *)0x0,(sxu32 *)0x0);
    pGen_local._4_4_ = 0;
  }
  else {
    sVar1 = GenStateFindLiteral(pGen,(SyString *)zIn,&local_4c);
    if (sVar1 == 0) {
      jx9VmEmitInstr(pjStack_18->pVm,4,0,local_4c,(void *)0x0,(sxu32 *)0x0);
      pGen_local._4_4_ = 0;
    }
    else {
      pjStack_48 = jx9VmReserveConstObj(pjStack_18->pVm,&local_4c);
      if (pjStack_48 == (jx9_value *)0x0) {
        jx9GenCompileError(pjStack_18,1,1,"JX9 engine is running out of memory");
        pGen_local._4_4_ = -10;
      }
      else {
        jx9MemObjInitFromString(pjStack_18->pVm,pjStack_48,(SyString *)0x0);
        for (; zData = zCur, zCur < pObj; zCur = zCur + 1) {
          zEnd = zCur;
          while( true ) {
            bVar3 = false;
            if (zCur < pObj) {
              bVar3 = *zCur != '\\';
            }
            if (!bVar3) break;
            zCur = zCur + 1;
          }
          if (zData < zCur) {
            jx9MemObjStringAppend(pjStack_48,zData,(int)zCur - (int)zData);
          }
          else {
            jx9MemObjStringAppend(pjStack_48,"",0);
          }
          pjVar2 = (jx9_value *)(zCur + 1);
          if (pjVar2 < pObj) {
            if (*(char *)&pjVar2->x == '\\') {
              zCur = (char *)pjVar2;
              jx9MemObjStringAppend(pjStack_48,"\\",1);
              pjVar2 = (jx9_value *)zCur;
            }
            else if (*(char *)&pjVar2->x == '\'') {
              zCur = (char *)pjVar2;
              jx9MemObjStringAppend(pjStack_48,"\'",1);
              pjVar2 = (jx9_value *)zCur;
            }
            else {
              jx9MemObjStringAppend(pjStack_48,zCur,2);
              pjVar2 = (jx9_value *)(zCur + 1);
            }
          }
          zCur = (char *)pjVar2;
        }
        jx9VmEmitInstr(pjStack_18->pVm,4,0,local_4c,(void *)0x0,(sxu32 *)0x0);
        if (*(uint *)(zIn + 8) < 0x400) {
          GenStateInstallLiteral(pjStack_18,pjStack_48,local_4c);
        }
        pGen_local._4_4_ = 0;
      }
    }
  }
  return pGen_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileSimpleString(jx9_gen_state *pGen, sxi32 iCompileFlag)
{
	SyString *pStr = &pGen->pIn->sData; /* Constant string literal */
	const char *zIn, *zCur, *zEnd;
	jx9_value *pObj;
	sxu32 nIdx;
	nIdx = 0; /* Prevent compiler warning */
	/* Delimit the string */
	zIn  = pStr->zString;
	zEnd = &zIn[pStr->nByte];
	if( zIn > zEnd ){
		/* Empty string, load NULL */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, 0, 0, 0);
		return SXRET_OK;
	}
	if( SXRET_OK == GenStateFindLiteral(&(*pGen), pStr, &nIdx) ){
		/* Already processed, emit the load constant instruction
		 * and return.
		 */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
		return SXRET_OK;
	}
	/* Reserve a new constant */
	pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
	if( pObj == 0 ){
		jx9GenCompileError(&(*pGen), E_ERROR, 1, "JX9 engine is running out of memory");
		SXUNUSED(iCompileFlag); /* cc warning */
		return SXERR_ABORT;
	}
	jx9MemObjInitFromString(pGen->pVm, pObj, 0);
	/* Compile the node */
	for(;;){
		if( zIn >= zEnd ){
			/* End of input */
			break;
		}
		zCur = zIn;
		while( zIn < zEnd && zIn[0] != '\\' ){
			zIn++;
		}
		if( zIn > zCur ){
			/* Append raw contents*/
			jx9MemObjStringAppend(pObj, zCur, (sxu32)(zIn-zCur));
		}
		else
		{
			jx9MemObjStringAppend(pObj, "", 0);
		}
		zIn++;
		if( zIn < zEnd ){
			if( zIn[0] == '\\' ){
				/* A literal backslash */
				jx9MemObjStringAppend(pObj, "\\", sizeof(char));
			}else if( zIn[0] == '\'' ){
				/* A single quote */
				jx9MemObjStringAppend(pObj, "'", sizeof(char));
			}else{
				/* verbatim copy */
				zIn--;
				jx9MemObjStringAppend(pObj, zIn, sizeof(char)*2);
				zIn++;
			}
		}
		/* Advance the stream cursor */
		zIn++;
	}
	/* Emit the load constant instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
	if( pStr->nByte < 1024 ){
		/* Install in the literal table */
		GenStateInstallLiteral(pGen, pObj, nIdx);
	}
	/* Node successfully compiled */
	return SXRET_OK;
}